

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialGradientShadingPatternWritingTask.cpp
# Opt level: O0

void __thiscall
RadialGradientShadingPatternWritingTask::RadialGradientShadingPatternWritingTask
          (RadialGradientShadingPatternWritingTask *this,double inX0,double inY0,double inR0,
          double inX1,double inY1,double inR1,InterpretedGradientStopList *inColorLine,
          FT_PaintExtend inGradientExtend,PDFRectangle *inBounds,PDFMatrix *inMatrix,
          ObjectIDType inPatternObjectId)

{
  ObjectIDType inPatternObjectId_local;
  PDFMatrix *inMatrix_local;
  PDFRectangle *inBounds_local;
  FT_PaintExtend inGradientExtend_local;
  InterpretedGradientStopList *inColorLine_local;
  double inR1_local;
  double inY1_local;
  double inX1_local;
  double inR0_local;
  double inY0_local;
  double inX0_local;
  RadialGradientShadingPatternWritingTask *this_local;
  
  IObjectEndWritingTask::IObjectEndWritingTask(&this->super_IObjectEndWritingTask);
  (this->super_IObjectEndWritingTask)._vptr_IObjectEndWritingTask =
       (_func_int **)&PTR__RadialGradientShadingPatternWritingTask_0054f390;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::list
            (&this->mColorLine);
  PDFRectangle::PDFRectangle(&this->mBounds);
  PDFMatrix::PDFMatrix(&this->mMatrix);
  this->x0 = inX0;
  this->y0 = inY0;
  this->r0 = inR0;
  this->x1 = inX1;
  this->y1 = inY1;
  this->r1 = inR1;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::operator=
            (&this->mColorLine,inColorLine);
  this->mGradientExtend = inGradientExtend;
  (this->mBounds).LowerLeftX = inBounds->LowerLeftX;
  (this->mBounds).LowerLeftY = inBounds->LowerLeftY;
  (this->mBounds).UpperRightX = inBounds->UpperRightX;
  (this->mBounds).UpperRightY = inBounds->UpperRightY;
  memcpy(&this->mMatrix,inMatrix,0x30);
  this->mPatternObjectId = inPatternObjectId;
  return;
}

Assistant:

RadialGradientShadingPatternWritingTask::RadialGradientShadingPatternWritingTask(
    double inX0,
    double inY0,
    double inR0,
    double inX1,
    double inY1,
    double inR1,
    InterpretedGradientStopList inColorLine,
    FT_PaintExtend inGradientExtend,
    PDFRectangle inBounds,
    PDFMatrix inMatrix,
    ObjectIDType inPatternObjectId
) {
   x0 = inX0;
   y0 = inY0;
   r0 = inR0;
   x1 = inX1;
   y1 = inY1;
   r1 = inR1;
   mColorLine = inColorLine;
   mGradientExtend = inGradientExtend;
   mBounds = inBounds;
   mMatrix = inMatrix;
   mPatternObjectId = inPatternObjectId;
}